

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TransformAC3_C(int16_t *in,uint8_t *dst)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *in_RSI;
  short *in_RDI;
  int DC_3;
  int DC_2;
  int DC_1;
  int DC;
  int d1;
  int c1;
  int d4;
  int c4;
  int a;
  
  iVar2 = *in_RDI + 4;
  iVar3 = in_RDI[4] * 0x8a8c >> 0x10;
  iVar4 = (in_RDI[4] * 0x4e7b >> 0x10) + (int)in_RDI[4];
  iVar5 = in_RDI[1] * 0x8a8c >> 0x10;
  iVar6 = (in_RDI[1] * 0x4e7b >> 0x10) + (int)in_RDI[1];
  iVar7 = iVar2 + iVar4;
  bVar1 = clip_8b((uint)*in_RSI + (iVar7 + iVar6 >> 3));
  *in_RSI = bVar1;
  bVar1 = clip_8b((uint)in_RSI[1] + (iVar7 + iVar5 >> 3));
  in_RSI[1] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[2] + (iVar7 - iVar5 >> 3));
  in_RSI[2] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[3] + (iVar7 - iVar6 >> 3));
  in_RSI[3] = bVar1;
  iVar7 = iVar2 + iVar3;
  bVar1 = clip_8b((uint)in_RSI[0x20] + (iVar7 + iVar6 >> 3));
  in_RSI[0x20] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x21] + (iVar7 + iVar5 >> 3));
  in_RSI[0x21] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x22] + (iVar7 - iVar5 >> 3));
  in_RSI[0x22] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x23] + (iVar7 - iVar6 >> 3));
  in_RSI[0x23] = bVar1;
  iVar3 = iVar2 - iVar3;
  bVar1 = clip_8b((uint)in_RSI[0x40] + (iVar3 + iVar6 >> 3));
  in_RSI[0x40] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x41] + (iVar3 + iVar5 >> 3));
  in_RSI[0x41] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x42] + (iVar3 - iVar5 >> 3));
  in_RSI[0x42] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x43] + (iVar3 - iVar6 >> 3));
  in_RSI[0x43] = bVar1;
  iVar2 = iVar2 - iVar4;
  bVar1 = clip_8b((uint)in_RSI[0x60] + (iVar2 + iVar6 >> 3));
  in_RSI[0x60] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x61] + (iVar2 + iVar5 >> 3));
  in_RSI[0x61] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[0x62] + (iVar2 - iVar5 >> 3));
  in_RSI[0x62] = bVar1;
  bVar1 = clip_8b((uint)in_RSI[99] + (iVar2 - iVar6 >> 3));
  in_RSI[99] = bVar1;
  return;
}

Assistant:

static void TransformAC3_C(const int16_t* in, uint8_t* dst) {
  const int a = in[0] + 4;
  const int c4 = MUL2(in[4]);
  const int d4 = MUL1(in[4]);
  const int c1 = MUL2(in[1]);
  const int d1 = MUL1(in[1]);
  STORE2(0, a + d4, d1, c1);
  STORE2(1, a + c4, d1, c1);
  STORE2(2, a - c4, d1, c1);
  STORE2(3, a - d4, d1, c1);
}